

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

upb_Message * upb_Message_New(upb_MiniTable *m,upb_Arena *a)

{
  ushort uVar1;
  ulong size;
  upb_Message *__s;
  
  uVar1 = m->size_dont_copy_me__upb_internal_use_only;
  size = (ulong)(uVar1 + 7 & 0xfffffff8);
  __s = (upb_Message *)a->ptr_dont_copy_me__upb_internal_use_only;
  if ((ulong)((long)a->end_dont_copy_me__upb_internal_use_only - (long)__s) < size) {
    __s = (upb_Message *)_upb_Arena_SlowMalloc_dont_copy_me__upb_internal_use_only(a,size);
  }
  else {
    if ((upb_Message *)((ulong)((long)&__s->field_0 + 7U) & 0xfffffffffffffff8) != __s) {
      __assert_fail("((((uintptr_t)ret) + (8) - 1) / (8) * (8)) == (uintptr_t)ret",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/upb/mem/internal/arena.h"
                    ,0x3f,"void *upb_Arena_Malloc(struct upb_Arena *, size_t)");
    }
    a->ptr_dont_copy_me__upb_internal_use_only = (char *)((long)&__s->field_0 + size);
  }
  if (__s != (upb_Message *)0x0) {
    memset(__s,0,(ulong)uVar1);
  }
  return __s;
}

Assistant:

upb_Message* upb_Message_New(const upb_MiniTable* m, upb_Arena* a) {
  return _upb_Message_New(m, a);
}